

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void codebinexpval(FuncState *fs,OpCode op,expdesc *e1,expdesc *e2,int line)

{
  int iVar1;
  int b;
  int rk1;
  int rk2;
  int line_local;
  expdesc *e2_local;
  expdesc *e1_local;
  OpCode op_local;
  FuncState *fs_local;
  
  iVar1 = luaK_exp2RK(fs,e2);
  b = luaK_exp2RK(fs,e1);
  freeexps(fs,e1,e2);
  switch(op) {
  case OP_ADD:
    if (e1->ravi_type_map == 0x10) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_ADDFF,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_ADDFI,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
    }
    else if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_ADDFI,0,iVar1,b);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 0x10;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_ADDII,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 8;
        break;
      }
    }
    iVar1 = luaK_codeABC(fs,OP_ADD,0,b,iVar1);
    (e1->u).info = iVar1;
    if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      if ((e1->ravi_type_map & e2->ravi_type_map & 8) == 0) {
        e1->ravi_type_map = 0x10;
      }
      else {
        e1->ravi_type_map = 0x18;
      }
    }
    else {
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_SUB:
    if (e1->ravi_type_map == 0x10) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_SUBFF,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_SUBFI,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
    }
    else if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_SUBIF,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 0x10;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_SUBII,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 8;
        break;
      }
    }
    iVar1 = luaK_codeABC(fs,OP_SUB,0,b,iVar1);
    (e1->u).info = iVar1;
    if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      if ((e1->ravi_type_map & e2->ravi_type_map & 8) == 0) {
        e1->ravi_type_map = 0x10;
      }
      else {
        e1->ravi_type_map = 0x18;
      }
    }
    else {
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_MUL:
    if (e1->ravi_type_map == 0x10) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_MULFF,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_MULFI,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
    }
    else if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_MULFI,0,iVar1,b);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 0x10;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_MULII,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 8;
        break;
      }
    }
    iVar1 = luaK_codeABC(fs,OP_MUL,0,b,iVar1);
    (e1->u).info = iVar1;
    if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      if ((e1->ravi_type_map & e2->ravi_type_map & 8) == 0) {
        e1->ravi_type_map = 0x10;
      }
      else {
        e1->ravi_type_map = 0x18;
      }
    }
    else {
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_MOD:
    if (e1->ravi_type_map == 0x10) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_MOD,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_MOD,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
    }
    else if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_MOD,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 0x10;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_MOD,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 8;
        break;
      }
    }
    iVar1 = luaK_codeABC(fs,OP_MOD,0,b,iVar1);
    (e1->u).info = iVar1;
    if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      if ((e1->ravi_type_map & e2->ravi_type_map & 8) == 0) {
        e1->ravi_type_map = 0x10;
      }
      else {
        e1->ravi_type_map = 0x18;
      }
    }
    else {
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_POW:
    if (e1->ravi_type_map == 0x10) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_POW,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_POW,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
    }
    else if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_POW,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 0x10;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_POW,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 0x10;
        break;
      }
    }
    iVar1 = luaK_codeABC(fs,OP_POW,0,b,iVar1);
    (e1->u).info = iVar1;
    if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      if ((e1->ravi_type_map & e2->ravi_type_map & 8) == 0) {
        e1->ravi_type_map = 0x10;
      }
      else {
        e1->ravi_type_map = 0x10;
      }
    }
    else {
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_DIV:
    if (e1->ravi_type_map == 0x10) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_DIVFF,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_DIVFI,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
    }
    else if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_DIVIF,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 0x10;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_RAVI_DIVII,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 0x10;
        break;
      }
    }
    iVar1 = luaK_codeABC(fs,OP_DIV,0,b,iVar1);
    (e1->u).info = iVar1;
    if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      if ((e1->ravi_type_map & e2->ravi_type_map & 8) == 0) {
        e1->ravi_type_map = 0x10;
      }
      else {
        e1->ravi_type_map = 0x10;
      }
    }
    else {
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_IDIV:
    if (e1->ravi_type_map == 0x10) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_IDIV,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_IDIV,0,b,iVar1);
        (e1->u).info = iVar1;
        break;
      }
    }
    else if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 0x10) {
        iVar1 = luaK_codeABC(fs,OP_IDIV,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 0x10;
        break;
      }
      if (e2->ravi_type_map == 8) {
        iVar1 = luaK_codeABC(fs,OP_IDIV,0,b,iVar1);
        (e1->u).info = iVar1;
        e1->ravi_type_map = 8;
        break;
      }
    }
    iVar1 = luaK_codeABC(fs,OP_IDIV,0,b,iVar1);
    (e1->u).info = iVar1;
    if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      if ((e1->ravi_type_map & e2->ravi_type_map & 8) == 0) {
        e1->ravi_type_map = 0x10;
      }
      else {
        e1->ravi_type_map = 0x18;
      }
    }
    else {
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_BAND:
    if ((e1->ravi_type_map == 8) && (e2->ravi_type_map == 8)) {
      iVar1 = luaK_codeABC(fs,OP_RAVI_BAND_II,0,b,iVar1);
      (e1->u).info = iVar1;
    }
    else if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      iVar1 = luaK_codeABC(fs,OP_BAND,0,b,iVar1);
      (e1->u).info = iVar1;
      e1->ravi_type_map = 8;
    }
    else {
      iVar1 = luaK_codeABC(fs,OP_BAND,0,b,iVar1);
      (e1->u).info = iVar1;
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_BOR:
    if ((e1->ravi_type_map == 8) && (e2->ravi_type_map == 8)) {
      iVar1 = luaK_codeABC(fs,OP_RAVI_BOR_II,0,b,iVar1);
      (e1->u).info = iVar1;
    }
    else if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      iVar1 = luaK_codeABC(fs,OP_BOR,0,b,iVar1);
      (e1->u).info = iVar1;
      e1->ravi_type_map = 8;
    }
    else {
      iVar1 = luaK_codeABC(fs,OP_BOR,0,b,iVar1);
      (e1->u).info = iVar1;
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_BXOR:
    if ((e1->ravi_type_map == 8) && (e2->ravi_type_map == 8)) {
      iVar1 = luaK_codeABC(fs,OP_RAVI_BXOR_II,0,b,iVar1);
      (e1->u).info = iVar1;
    }
    else if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      iVar1 = luaK_codeABC(fs,OP_BXOR,0,b,iVar1);
      (e1->u).info = iVar1;
      e1->ravi_type_map = 8;
    }
    else {
      iVar1 = luaK_codeABC(fs,OP_BXOR,0,b,iVar1);
      (e1->u).info = iVar1;
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_SHL:
    if ((e1->ravi_type_map == 8) && (e2->ravi_type_map == 8)) {
      iVar1 = luaK_codeABC(fs,OP_RAVI_SHL_II,0,b,iVar1);
      (e1->u).info = iVar1;
    }
    else if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      iVar1 = luaK_codeABC(fs,OP_SHL,0,b,iVar1);
      (e1->u).info = iVar1;
      e1->ravi_type_map = 8;
    }
    else {
      iVar1 = luaK_codeABC(fs,OP_SHL,0,b,iVar1);
      (e1->u).info = iVar1;
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OP_SHR:
    if ((e1->ravi_type_map == 8) && (e2->ravi_type_map == 8)) {
      iVar1 = luaK_codeABC(fs,OP_RAVI_SHR_II,0,b,iVar1);
      (e1->u).info = iVar1;
    }
    else if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      iVar1 = luaK_codeABC(fs,OP_SHR,0,b,iVar1);
      (e1->u).info = iVar1;
      e1->ravi_type_map = 8;
    }
    else {
      iVar1 = luaK_codeABC(fs,OP_SHR,0,b,iVar1);
      (e1->u).info = iVar1;
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  default:
    iVar1 = luaK_codeABC(fs,op,0,b,iVar1);
    (e1->u).info = iVar1;
    e1->ravi_type_map = 0xffffffff;
    break;
  case OP_CONCAT:
    iVar1 = luaK_codeABC(fs,op,0,b,iVar1);
    (e1->u).info = iVar1;
    if (((e1->ravi_type_map & 0xfffffee7) == 0) && ((e2->ravi_type_map & 0xfffffee7) == 0)) {
      e1->ravi_type_map = 0x100;
    }
    else {
      e1->ravi_type_map = 0xffffffff;
    }
  }
  e1->k = VRELOCABLE;
  luaK_fixline(fs,line);
  return;
}

Assistant:

static void codebinexpval (FuncState *fs, OpCode op,
                           expdesc *e1, expdesc *e2, int line) {
  /* Note that the order below is important - see Lua 5.3.3 bug list*/
  int rk2 = luaK_exp2RK(fs, e2);  /* both operands are "RK" */
  int rk1 = luaK_exp2RK(fs, e1);
  freeexps(fs, e1, e2);

#define RAVI_OPCODE_SPECIALIZED(op, t) OP_RAVI_##op##t
#define RAVI_OPCODE_GENERIC(op, t) OP_##op
#define RAVI_COMMUTATIVE(op, t) luaK_codeABC(fs, t(op, FI), 0, rk2, rk1)
#define RAVI_NON_COMMUTATIVE(op, t) luaK_codeABC(fs, t(op, IF), 0, rk1, rk2)
#define RAVI_GEN_ARITH(op, co, ii, t)                                      \
  case OP_##op:                                                            \
    if (e1->ravi_type_map == RAVI_TM_FLOAT) {                              \
      if (e2->ravi_type_map == RAVI_TM_FLOAT) {                            \
        e1->u.info = luaK_codeABC(fs, t(op, FF), 0, rk1, rk2);             \
        break;                                                             \
      }                                                                    \
      else if (e2->ravi_type_map == RAVI_TM_INTEGER) {                     \
        e1->u.info = luaK_codeABC(fs, t(op, FI), 0, rk1, rk2);             \
        break;                                                             \
      }                                                                    \
    }                                                                      \
    else if (e1->ravi_type_map == RAVI_TM_INTEGER) {                       \
      if (e2->ravi_type_map == RAVI_TM_FLOAT) {                            \
        e1->u.info = co(op, t);                                            \
        e1->ravi_type_map = RAVI_TM_FLOAT;                                 \
        break;                                                             \
      }                                                                    \
      else if (e2->ravi_type_map == RAVI_TM_INTEGER) {                     \
        e1->u.info = luaK_codeABC(fs, t(op, II), 0, rk1, rk2);             \
        e1->ravi_type_map = ii;                                            \
        break;                                                             \
      }                                                                    \
    }                                                                      \
    e1->u.info = luaK_codeABC(fs, OP_##op, 0, rk1, rk2);                   \
    if ((e1->ravi_type_map & (~(RAVI_TM_FLOAT | RAVI_TM_INTEGER))) == 0 && \
        (e2->ravi_type_map & (~(RAVI_TM_FLOAT | RAVI_TM_INTEGER))) == 0) { \
      if (e1->ravi_type_map & e2->ravi_type_map & RAVI_TM_INTEGER) {       \
        e1->ravi_type_map = RAVI_TM_FLOAT | ii;                            \
      }                                                                    \
      else {                                                               \
        e1->ravi_type_map = RAVI_TM_FLOAT;                                 \
      }                                                                    \
    }                                                                      \
    else {                                                                 \
      e1->ravi_type_map = RAVI_TM_ANY;                                     \
    }                                                                      \
    break

#define RAVI_GEN_INT_OP(op)                                                                                  \
  case OP_##op:                                                                                              \
    if (e1->ravi_type_map == RAVI_TM_INTEGER && e2->ravi_type_map == RAVI_TM_INTEGER) {                      \
      e1->u.info = luaK_codeABC(fs, OP_RAVI_##op##_II, 0, rk1, rk2);                                         \
    }                                                                                                        \
    else if ((e1->ravi_type_map & (~RAVI_TM_NUMBER)) == 0 && (e2->ravi_type_map & (~RAVI_TM_NUMBER)) == 0) { \
      e1->u.info = luaK_codeABC(fs, OP_##op, 0, rk1, rk2);                                                   \
      e1->ravi_type_map = RAVI_TM_INTEGER;                                                                   \
    }                                                                                                        \
    else {                                                                                                   \
      e1->u.info = luaK_codeABC(fs, OP_##op, 0, rk1, rk2);                                                   \
      e1->ravi_type_map = RAVI_TM_ANY;                                                                       \
    }                                                                                                        \
    break

  switch (op) {
    RAVI_GEN_ARITH(ADD, RAVI_COMMUTATIVE, RAVI_TM_INTEGER, RAVI_OPCODE_SPECIALIZED);
    RAVI_GEN_ARITH(SUB, RAVI_NON_COMMUTATIVE, RAVI_TM_INTEGER, RAVI_OPCODE_SPECIALIZED);
    RAVI_GEN_ARITH(MUL, RAVI_COMMUTATIVE, RAVI_TM_INTEGER, RAVI_OPCODE_SPECIALIZED);
    RAVI_GEN_ARITH(DIV, RAVI_NON_COMMUTATIVE, RAVI_TM_FLOAT, RAVI_OPCODE_SPECIALIZED);
    RAVI_GEN_ARITH(IDIV, RAVI_NON_COMMUTATIVE, RAVI_TM_INTEGER, RAVI_OPCODE_GENERIC);
    RAVI_GEN_ARITH(MOD, RAVI_NON_COMMUTATIVE, RAVI_TM_INTEGER, RAVI_OPCODE_GENERIC);
    RAVI_GEN_ARITH(POW, RAVI_NON_COMMUTATIVE, RAVI_TM_FLOAT, RAVI_OPCODE_GENERIC);
    RAVI_GEN_INT_OP(BAND);
    RAVI_GEN_INT_OP(BOR);
    RAVI_GEN_INT_OP(BXOR);
    RAVI_GEN_INT_OP(SHL);
    RAVI_GEN_INT_OP(SHR);
    case OP_CONCAT:
      e1->u.info = luaK_codeABC(fs, op, 0, rk1, rk2);
      if ((e1->ravi_type_map & (~(RAVI_TM_STRING | RAVI_TM_INTEGER | RAVI_TM_FLOAT))) == 0 &&
          (e2->ravi_type_map & (~(RAVI_TM_STRING | RAVI_TM_INTEGER | RAVI_TM_FLOAT))) == 0) {
        e1->ravi_type_map = RAVI_TM_STRING;
      }
      else {
        e1->ravi_type_map = RAVI_TM_ANY;
      }
      break;
    default:
      e1->u.info = luaK_codeABC(fs, op, 0, rk1, rk2);
      e1->ravi_type_map = RAVI_TM_ANY;
  }

  e1->k = VRELOCABLE;  /* all those operations are relocatable */
  luaK_fixline(fs, line);
}